

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AsciiCreate(void *pUnused,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  char *zArg_00;
  uint uVar1;
  int iVar2;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  char *zArg;
  int i;
  AsciiTokenizer *p;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int local_34;
  AsciiTokenizer *local_30;
  int local_24;
  
  local_24 = 0;
  local_30 = (AsciiTokenizer *)0x0;
  if (in_EDX % 2 == 0) {
    local_30 = (AsciiTokenizer *)sqlite3_malloc(in_stack_ffffffffffffffbc);
    if (local_30 == (AsciiTokenizer *)0x0) {
      local_24 = 7;
    }
    else {
      memset(local_30,0,0x80);
      memcpy(local_30,aAsciiTokenChar,0x80);
      local_34 = 0;
      while( true ) {
        uVar1 = in_stack_ffffffffffffffbc & 0xffffff;
        if (local_24 == 0) {
          uVar1 = CONCAT13(local_34 < in_EDX,(int3)in_stack_ffffffffffffffbc);
        }
        in_stack_ffffffffffffffbc = uVar1;
        if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
        zArg_00 = *(char **)(in_RSI + (long)(local_34 + 1) * 8);
        iVar2 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ),(char *)0x28fde0);
        if (iVar2 == 0) {
          fts5AsciiAddExceptions(local_30,zArg_00,1);
        }
        else {
          iVar2 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                   in_stack_ffffffffffffffb8),(char *)0x28fe18);
          if (iVar2 == 0) {
            fts5AsciiAddExceptions(local_30,zArg_00,0);
          }
          else {
            local_24 = 1;
          }
        }
        local_34 = local_34 + 2;
      }
      if (local_24 != 0) {
        fts5AsciiDelete((Fts5Tokenizer *)0x28fe60);
        local_30 = (AsciiTokenizer *)0x0;
      }
    }
  }
  else {
    local_24 = 1;
  }
  *in_RCX = local_30;
  return local_24;
}

Assistant:

static int fts5AsciiCreate(
  void *pUnused,
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  int rc = SQLITE_OK;
  AsciiTokenizer *p = 0;
  UNUSED_PARAM(pUnused);
  if( nArg%2 ){
    rc = SQLITE_ERROR;
  }else{
    p = sqlite3_malloc(sizeof(AsciiTokenizer));
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int i;
      memset(p, 0, sizeof(AsciiTokenizer));
      memcpy(p->aTokenChar, aAsciiTokenChar, sizeof(aAsciiTokenChar));
      for(i=0; rc==SQLITE_OK && i<nArg; i+=2){
        const char *zArg = azArg[i+1];
        if( 0==sqlite3_stricmp(azArg[i], "tokenchars") ){
          fts5AsciiAddExceptions(p, zArg, 1);
        }else
        if( 0==sqlite3_stricmp(azArg[i], "separators") ){
          fts5AsciiAddExceptions(p, zArg, 0);
        }else{
          rc = SQLITE_ERROR;
        }
      }
      if( rc!=SQLITE_OK ){
        fts5AsciiDelete((Fts5Tokenizer*)p);
        p = 0;
      }
    }
  }

  *ppOut = (Fts5Tokenizer*)p;
  return rc;
}